

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# files.cpp
# Opt level: O1

size_t __thiscall BufferWriter::Write(BufferWriter *this,void *buffer,size_t len)

{
  uint uVar1;
  
  TArray<unsigned_char,_unsigned_char>::Grow(&this->mBuffer,(uint)len);
  uVar1 = (this->mBuffer).Count;
  (this->mBuffer).Count = uVar1 + (uint)len;
  memcpy((this->mBuffer).Array + uVar1,buffer,len);
  return len;
}

Assistant:

size_t BufferWriter::Write(const void *buffer, size_t len)
{
	unsigned int ofs = mBuffer.Reserve((unsigned)len);
	memcpy(&mBuffer[ofs], buffer, len);
	return len;
}